

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocketabstraction_p.h
# Opt level: O2

SocketError QSocketAbstraction::socketError(QIODevice *device)

{
  SocketError SVar1;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 getError;
  anon_class_1_0_00000001 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = (anon_class_1_0_00000001)0xaa;
  SVar1 = visit<QSocketAbstraction::socketError(QIODevice*)::_lambda(auto:1*)_1_&>(&local_9,device);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return SVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline QAbstractSocket::SocketError socketError(QIODevice *device)
{
    auto getError = [](auto *s) {
        using T = std::remove_pointer_t<decltype(s)>;
        if constexpr (std::is_same_v<T, QAbstractSocket>) {
            return s->error();
#if QT_CONFIG(localserver)
        } else if constexpr (std::is_same_v<T, QLocalSocket>) {
            QLocalSocket::LocalSocketError st = s->error();
            return static_cast<QAbstractSocket::SocketError>(st);
#endif
        }
        Q_UNREACHABLE();
    };
    return visit(getError, device);
}